

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O3

void __thiscall brown::Tile::drawrectfill(Tile *this,int x0,int y0,int x1,int y1,uint32_t col)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  
  auVar3 = _DAT_001081a0;
  auVar2 = _DAT_00108190;
  auVar1 = _DAT_00108180;
  if (x0 < 1) {
    x0 = 0;
  }
  if (this->x < x1) {
    x1 = this->x;
  }
  if (x0 < x1) {
    iVar4 = 0;
    if (0 < y0) {
      iVar4 = y0;
    }
    if (this->y < y1) {
      y1 = this->y;
    }
    if (iVar4 < y1) {
      lVar5 = (long)iVar4 * (long)this->p + this->f;
      lVar6 = (ulong)(uint)x1 - (ulong)(uint)x0;
      lVar7 = lVar6 + -1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar9 = auVar9 ^ _DAT_001081a0;
      do {
        lVar7 = lVar5 + (ulong)(uint)x0 * 4 + 0xc;
        uVar8 = 0;
        do {
          auVar11._8_4_ = (int)uVar8;
          auVar11._0_8_ = uVar8;
          auVar11._12_4_ = (int)(uVar8 >> 0x20);
          auVar12 = (auVar11 | auVar2) ^ auVar3;
          iVar10 = auVar9._4_4_;
          if ((bool)(~(auVar12._4_4_ == iVar10 && auVar9._0_4_ < auVar12._0_4_ ||
                      iVar10 < auVar12._4_4_) & 1)) {
            *(uint32_t *)(lVar7 + -0xc + uVar8 * 4) = col;
          }
          if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
              auVar12._12_4_ <= auVar9._12_4_) {
            *(uint32_t *)(lVar7 + -8 + uVar8 * 4) = col;
          }
          auVar11 = (auVar11 | auVar1) ^ auVar3;
          iVar13 = auVar11._4_4_;
          if (iVar13 <= iVar10 && (iVar13 != iVar10 || auVar11._0_4_ <= auVar9._0_4_)) {
            *(uint32_t *)(lVar7 + -4 + uVar8 * 4) = col;
            *(uint32_t *)(lVar7 + uVar8 * 4) = col;
          }
          uVar8 = uVar8 + 4;
        } while ((lVar6 + 3U & 0xfffffffffffffffc) != uVar8);
        iVar4 = iVar4 + 1;
        lVar5 = lVar5 + this->p;
      } while (iVar4 != y1);
    }
  }
  return;
}

Assistant:

void Tile::drawrectfill (int x0, int y0, int x1, int y1, std::uint32_t col)
{
    int x, y;
    std::uint32_t *lptr;

    x0 = max(x0,0); x1 = min(x1,this->x); if (x0 >= x1) return;
    y0 = max(y0,0); y1 = min(y1,this->y); if (y0 >= y1) return;
    lptr = (std::uint32_t *)(this->p*y0 + this->f);
    for(y=y0;y<y1;y++,lptr=(std::uint32_t *)(((intptr_t)lptr)+this->p))
        for(x=x0;x<x1;x++) lptr[x] = col;
}